

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::Consume(ParserImpl *this,string *value)

{
  bool bVar1;
  Token *pTVar2;
  AlphaNum local_148;
  AlphaNum local_118;
  AlphaNum local_e8;
  AlphaNum local_b8;
  AlphaNum local_88;
  string local_58;
  string_view local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  string *current_value;
  string *value_local;
  ParserImpl *this_local;
  
  current_value = value;
  value_local = (string *)this;
  pTVar2 = io::Tokenizer::current(&this->tokenizer_);
  local_28 = &pTVar2->text;
  bVar1 = std::operator!=(local_28,current_value);
  if (bVar1) {
    absl::lts_20250127::AlphaNum::AlphaNum(&local_88,"Expected \"");
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_b8,current_value);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_e8,"\", found \"");
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_118,local_28);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_148,"\".");
    absl::lts_20250127::StrCat<>(&local_58,&local_88,&local_b8,&local_e8,&local_118,&local_148);
    local_38 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_58);
    ReportError(this,local_38);
    std::__cxx11::string::~string((string *)&local_58);
  }
  else {
    io::Tokenizer::Next(&this->tokenizer_);
  }
  this_local._7_1_ = !bVar1;
  return this_local._7_1_;
}

Assistant:

bool Consume(const std::string& value) {
    const std::string& current_value = tokenizer_.current().text;

    if (current_value != value) {
      ReportError(absl::StrCat("Expected \"", value, "\", found \"",
                               current_value, "\"."));
      return false;
    }

    tokenizer_.Next();

    return true;
  }